

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O1

void BamTools::Options::AddValueOption<std::__cxx11::string>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
               OptionGroup *group)

{
  size_t *psVar1;
  pointer pcVar2;
  mapped_type *pmVar3;
  OptionValue ov;
  Option o;
  Variant local_110;
  bool *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  undefined2 local_d8;
  bool local_d6;
  Variant local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined2 local_40;
  Variant local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  local_a0._8_8_ = 0;
  local_a0[0x10] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60._M_p = (pointer)&local_50;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._0_1_ = true;
  local_40._1_1_ = false;
  local_38.data = (ImplBase *)0x0;
  std::__cxx11::string::_M_assign((string *)local_a0);
  std::__cxx11::string::_M_assign((string *)&local_80);
  std::__cxx11::string::_M_assign((string *)&local_60);
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            (&group->Options,(value_type *)local_a0);
  local_f0 = 0;
  local_e8[0] = 0;
  local_d8 = 0x100;
  local_d6 = false;
  local_d0[0].data = (ImplBase *)0x0;
  pcVar2 = (val->_M_dataplus)._M_p;
  local_108 = foundArgument;
  pbStack_100 = val;
  local_f8 = local_e8;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + val->_M_string_length);
  Variant::Variant<std::__cxx11::string>(&local_110,&local_c0);
  if (local_110.data != (ImplBase *)0x0) {
    (local_110.data)->refs = (local_110.data)->refs + 1;
  }
  if (local_d0[0].data != (ImplBase *)0x0) {
    psVar1 = &(local_d0[0].data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_d0[0].data)->_vptr_ImplBase[1])();
    }
  }
  local_d0[0].data = local_110.data;
  if (local_110.data != (ImplBase *)0x0) {
    psVar1 = &(local_110.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_110.data)->_vptr_ImplBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_d6 = valueTypeDescription->_M_string_length != 0;
  std::__cxx11::string::_M_assign((string *)&local_f8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
           ::operator[](&m_optionsMap_abi_cxx11_,argument);
  pmVar3->pFoundArgument = local_108;
  pmVar3->pValue = pbStack_100;
  std::__cxx11::string::_M_assign((string *)&pmVar3->ValueTypeDescription);
  pmVar3->IsRequired = local_d6;
  pmVar3->UseVector = (bool)(undefined1)local_d8;
  pmVar3->StoreValue = (bool)local_d8._1_1_;
  Variant::operator=(&pmVar3->VariantValue,local_d0);
  if (local_d0[0].data != (ImplBase *)0x0) {
    psVar1 = &(local_d0[0].data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_d0[0].data)->_vptr_ImplBase[1])();
    }
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_38.data != (ImplBase *)0x0) {
    psVar1 = &(local_38.data)->refs;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      (*(local_38.data)->_vptr_ImplBase[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_);
  }
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}